

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O3

uint8_t __thiscall wabt::ElemSegment::GetFlags(ElemSegment *this,Module *module)

{
  SegmentKind SVar1;
  pointer piVar2;
  byte bVar3;
  Index IVar4;
  pointer piVar5;
  pointer piVar6;
  long lVar7;
  long lVar8;
  
  SVar1 = this->kind;
  if (SVar1 == Declared) {
    bVar3 = 3;
  }
  else if (SVar1 == Passive) {
    bVar3 = 1;
  }
  else if (SVar1 == Active) {
    IVar4 = BindingHash::FindIndex(&module->table_bindings,&this->table_var);
    bVar3 = ((this->elem_type).enum_ != FuncRef || IVar4 != 0) * '\x02';
  }
  else {
    bVar3 = 0;
  }
  if ((this->elem_type).enum_ != FuncRef) goto LAB_001275b8;
  piVar5 = (this->elem_exprs).
           super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar2 = (this->elem_exprs).
           super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar8 = (long)piVar2 - (long)piVar5;
  lVar7 = (lVar8 >> 3) * -0x5555555555555555 >> 2;
  if (0 < lVar7) {
    lVar8 = lVar7 + 1;
    piVar6 = piVar5 + 2;
    do {
      if (piVar6[-2].size_ == 0) goto LAB_001275bc;
      if ((piVar6[-2].first_)->type_ != RefFunc) {
        piVar6 = piVar6 + -2;
        goto LAB_001275b3;
      }
      if (piVar6[-1].size_ == 0) goto LAB_001275bc;
      if ((piVar6[-1].first_)->type_ != RefFunc) {
        piVar6 = piVar6 + -1;
        goto LAB_001275b3;
      }
      if (piVar6->size_ == 0) goto LAB_001275bc;
      if (piVar6->first_->type_ != RefFunc) goto LAB_001275b3;
      if (piVar6[1].size_ == 0) goto LAB_001275bc;
      if ((piVar6[1].first_)->type_ != RefFunc) {
        piVar6 = piVar6 + 1;
        goto LAB_001275b3;
      }
      lVar8 = lVar8 + -1;
      piVar6 = piVar6 + 4;
    } while (1 < lVar8);
    lVar8 = (long)piVar2 - (long)(piVar5 + lVar7 * 4);
    piVar5 = piVar5 + lVar7 * 4;
  }
  lVar7 = (lVar8 >> 3) * -0x5555555555555555;
  if (lVar7 == 1) {
LAB_0012758c:
    if (piVar5->size_ == 0) {
LAB_001275bc:
      __assert_fail("!empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/intrusive-list.h"
                    ,0x18a,
                    "typename intrusive_list<T>::const_reference wabt::intrusive_list<wabt::Expr>::front() const [T = wabt::Expr]"
                   );
    }
    piVar6 = piVar5;
    if (piVar5->first_->type_ == RefFunc) {
      piVar6 = piVar2;
    }
  }
  else if (lVar7 == 2) {
LAB_00127578:
    if (piVar5->size_ == 0) goto LAB_001275bc;
    piVar6 = piVar5;
    if (piVar5->first_->type_ == RefFunc) {
      piVar5 = piVar5 + 1;
      goto LAB_0012758c;
    }
  }
  else {
    if (lVar7 != 3) {
      return bVar3;
    }
    if (piVar5->size_ == 0) goto LAB_001275bc;
    piVar6 = piVar5;
    if (piVar5->first_->type_ == RefFunc) {
      piVar5 = piVar5 + 1;
      goto LAB_00127578;
    }
  }
LAB_001275b3:
  if (piVar6 == piVar2) {
    return bVar3;
  }
LAB_001275b8:
  return bVar3 | 4;
}

Assistant:

uint8_t ElemSegment::GetFlags(const Module* module) const {
  uint8_t flags = 0;

  switch (kind) {
    case SegmentKind::Active: {
      Index table_index = module->GetTableIndex(table_var);
      if (elem_type != Type::FuncRef || table_index != 0) {
        flags |= SegExplicitIndex;
      }
      break;
    }

    case SegmentKind::Passive:
      flags |= SegPassive;
      break;

    case SegmentKind::Declared:
      flags |= SegDeclared;
      break;
  }

  bool all_ref_func =
      elem_type == Type::FuncRef &&
      std::all_of(elem_exprs.begin(), elem_exprs.end(),
                  [](const ExprList& elem_expr) {
                    return elem_expr.front().type() == ExprType::RefFunc;
                  });

  if (!all_ref_func) {
    flags |= SegUseElemExprs;
  }

  return flags;
}